

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O1

prepare_function_for_t<short> *
prepare_for<short>(prepare_function_for_t<short> *__return_storage_ptr__,string *prepare_type)

{
  int iVar1;
  const_iterator cVar2;
  logic_error *this;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_message;
  undefined1 local_1e6;
  undefined1 local_1e5;
  undefined1 local_1e4;
  pipe_organ_fn local_1e3;
  sort_fn<std::greater<void>_> local_1e2;
  sort_fn<std::less<void>_> local_1e1;
  single_fn local_1e0;
  outlier_fn local_1d0;
  undefined1 local_1c0 [32];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
  local_1a0 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
  local_60;
  
  if (prepare_for<short>(std::__cxx11::string_const&)::prepare_functions_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&prepare_for<short>(std::__cxx11::string_const&)::
                                 prepare_functions_abi_cxx11_);
    if (iVar1 != 0) {
      local_1c0._0_8_ = (random_device *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::random_device,std::allocator<std::random_device>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c0 + 8),
                 (random_device **)local_1c0,(allocator<std::random_device> *)&local_1d0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
      ::pair<const_char_(&)[8],_shuffle_fn,_true>
                (local_1a0,(char (*) [8])"shuffle",(shuffle_fn *)local_1c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
      ::pair<const_char_(&)[10],_sort_fn<std::less<void>_>,_true>
                (local_1a0 + 1,(char (*) [10])"ascending",&local_1e1);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
      ::pair<const_char_(&)[11],_sort_fn<std::greater<void>_>,_true>
                (local_1a0 + 2,(char (*) [11])"descending",&local_1e2);
      local_1d0.rd.super___shared_ptr<std::random_device,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::random_device,std::allocator<std::random_device>>
                (&local_1d0.rd.super___shared_ptr<std::random_device,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(random_device **)&local_1d0,
                 (allocator<std::random_device> *)&local_1e0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
      ::pair<const_char_(&)[8],_outlier_fn,_true>(local_1a0 + 3,(char (*) [8])"outlier",&local_1d0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
      ::pair<const_char_(&)[11],_pipe_organ_fn,_true>
                (&local_a0,(char (*) [11])(anon_var_dwarf_fc2f7 + 0xa9),&local_1e3);
      local_1e0.rd.super___shared_ptr<std::random_device,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::random_device,std::allocator<std::random_device>>
                (&local_1e0.rd.super___shared_ptr<std::random_device,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(random_device **)&local_1e0,
                 (allocator<std::random_device> *)&local_1e6);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
      ::pair<const_char_(&)[7],_single_fn,_true>(&local_60,(char (*) [7])"single",&local_1e0);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::vector<short,std::allocator<short>>(std::vector<short,std::allocator<short>>)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::vector<short,std::allocator<short>>(std::vector<short,std::allocator<short>>)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _Hashtable<std::pair<std::__cxx11::string_const,std::function<std::vector<short,std::allocator<short>>(std::vector<short,std::allocator<short>>)>>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<std::vector<short,std::allocator<short>>(std::vector<short,std::allocator<short>>)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::vector<short,std::allocator<short>>(std::vector<short,std::allocator<short>>)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&prepare_for<short>(std::__cxx11::string_const&)::prepare_functions_abi_cxx11_,
                 local_1a0,&stack0xffffffffffffffe0,0,&local_1e6,&local_1e4,&local_1e5);
      lVar3 = 0x140;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
                 *)((long)&local_1a0[0].first._M_dataplus._M_p + lVar3));
        lVar3 = lVar3 + -0x40;
      } while (lVar3 != -0x40);
      if (local_1e0.rd.super___shared_ptr<std::random_device,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1e0.rd.super___shared_ptr<std::random_device,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_1d0.rd.super___shared_ptr<std::random_device,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d0.rd.super___shared_ptr<std::random_device,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
      }
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>_>_>
                   ::~unordered_map,
                   &prepare_for<short>(std::__cxx11::string_const&)::prepare_functions_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&prepare_for<short>(std::__cxx11::string_const&)::
                           prepare_functions_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&prepare_for<short>(std::__cxx11::string_const&)::prepare_functions_abi_cxx11_._M_h
                 ,prepare_type);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::
    function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>
    ::function(__return_storage_ptr__,
               (function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>
                *)((long)cVar2.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>,_true>
                         ._M_cur + 0x28));
    return __return_storage_ptr__;
  }
  local_1c0._0_8_ = (random_device *)(local_1c0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,anon_var_dwarf_fe71e,anon_var_dwarf_fe71e + 0x3d);
  std::operator+(&local_1a0[0].first,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                 prepare_type);
  if ((random_device *)local_1c0._0_8_ != (random_device *)(local_1c0 + 0x10)) {
    operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,(string *)local_1a0);
  *(undefined ***)this = &PTR__logic_error_001a4588;
  __cxa_throw(this,&boost::program_options::error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

prepare_function_for_t<Value> prepare_for (const std::string & prepare_type)
{
    static const auto prepare_functions =
        std::unordered_map<std::string, prepare_function_for_t<Value>>
        {
            {"shuffle", shuffle_fn{}},
            {"ascending", sort_fn<std::less<>>{}},
            {"descending", sort_fn<std::greater<>>{}},
            {"outlier", outlier_fn{}},
            {"pipe-organ", pipe_organ_fn{}},
            {"single", single_fn{}}
        };

    auto prepare_function = prepare_functions.find(prepare_type);
    if (prepare_function != prepare_functions.end())
    {
        return prepare_function->second;
    }
    else
    {
        const auto error_message = u8"Неверный тип подготовки массива: "_u8s + prepare_type;
        throw boost::program_options::error(error_message);
    }
}